

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O2

void __thiscall
perfetto::SharedMemoryArbiterImpl::ReleaseWriterID(SharedMemoryArbiterImpl *this,WriterID id)

{
  WriterID WVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  iterator __position;
  TaskRunner *pTVar4;
  bool bVar5;
  WriterID id_local;
  __shared_ptr<perfetto::SharedMemoryArbiterImpl_*,_(__gnu_cxx::_Lock_policy)2> local_78;
  WriterID local_68;
  _Any_data local_58;
  code *local_48;
  code *pcStack_40;
  WeakPtr<perfetto::SharedMemoryArbiterImpl> weak_this;
  
  id_local = id;
  ::std::mutex::lock((mutex *)&this->lock_);
  IdAllocator<unsigned_short>::Free(&this->active_writer_ids_,id);
  __position = std::
               _Rb_tree<unsigned_short,_std::pair<const_unsigned_short,_unsigned_int>,_std::_Select1st<std::pair<const_unsigned_short,_unsigned_int>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_unsigned_int>_>_>
               ::find(&(this->pending_writers_)._M_t,&id_local);
  if ((_Rb_tree_header *)__position._M_node ==
      &(this->pending_writers_)._M_t._M_impl.super__Rb_tree_header) {
    pTVar4 = this->task_runner_;
    bVar5 = pTVar4 != (TaskRunner *)0x0;
  }
  else {
    ::std::
    _Rb_tree<unsigned_short,std::pair<unsigned_short_const,unsigned_int>,std::_Select1st<std::pair<unsigned_short_const,unsigned_int>>,std::less<unsigned_short>,std::allocator<std::pair<unsigned_short_const,unsigned_int>>>
    ::erase_abi_cxx11_((_Rb_tree<unsigned_short,std::pair<unsigned_short_const,unsigned_int>,std::_Select1st<std::pair<unsigned_short_const,unsigned_int>>,std::less<unsigned_short>,std::allocator<std::pair<unsigned_short_const,unsigned_int>>>
                        *)&this->pending_writers_,__position);
    pTVar4 = (TaskRunner *)0x0;
    bVar5 = false;
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->lock_);
  if (bVar5) {
    std::__shared_ptr<perfetto::SharedMemoryArbiterImpl_*,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<perfetto::SharedMemoryArbiterImpl_*,_(__gnu_cxx::_Lock_policy)2> *)
               &weak_this,
               (__shared_ptr<perfetto::SharedMemoryArbiterImpl_*,_(__gnu_cxx::_Lock_policy)2> *)
               &this->weak_ptr_factory_);
    std::__shared_ptr<perfetto::SharedMemoryArbiterImpl_*,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_78,
               (__shared_ptr<perfetto::SharedMemoryArbiterImpl_*,_(__gnu_cxx::_Lock_policy)2> *)
               &weak_this);
    WVar1 = id_local;
    local_68 = id_local;
    local_58._M_unused._M_object = (void *)0x0;
    local_58._8_8_ = 0;
    local_48 = (code *)0x0;
    pcStack_40 = (code *)0x0;
    local_58._M_unused._M_object = operator_new(0x18);
    uVar2 = local_78._M_refcount._M_pi._0_4_;
    uVar3 = local_78._M_refcount._M_pi._4_4_;
    local_78._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    *(undefined4 *)local_58._M_unused._0_8_ = local_78._M_ptr._0_4_;
    *(undefined4 *)((long)local_58._M_unused._0_8_ + 4) = local_78._M_ptr._4_4_;
    *(undefined4 *)((long)local_58._M_unused._0_8_ + 8) = uVar2;
    *(undefined4 *)((long)local_58._M_unused._0_8_ + 0xc) = uVar3;
    local_78._M_ptr = (element_type *)0x0;
    *(WriterID *)((long)local_58._M_unused._0_8_ + 0x10) = WVar1;
    pcStack_40 = std::
                 _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/perfetto-connector/perfetto/perfetto.cc:39150:25)>
                 ::_M_invoke;
    local_48 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/perfetto-connector/perfetto/perfetto.cc:39150:25)>
               ::_M_manager;
    (*pTVar4->_vptr_TaskRunner[2])(pTVar4);
    ::std::_Function_base::~_Function_base((_Function_base *)&local_58);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_78._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&weak_this.handle_.
                super___shared_ptr<perfetto::SharedMemoryArbiterImpl_*,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  return;
}

Assistant:

void SharedMemoryArbiterImpl::ReleaseWriterID(WriterID id) {
  base::TaskRunner* task_runner = nullptr;
  {
    std::lock_guard<std::mutex> scoped_lock(lock_);
    active_writer_ids_.Free(id);

    auto it = pending_writers_.find(id);
    if (it != pending_writers_.end()) {
      // Writer hasn't been bound yet and thus also not yet registered with the
      // service.
      pending_writers_.erase(it);
      return;
    }

    // A trace writer from an aborted session may be destroyed before the
    // arbiter is bound to a task runner. In that case, it was never registered
    // with the service.
    if (!task_runner_)
      return;

    task_runner = task_runner_;
  }  // scoped_lock

  // We shouldn't post tasks while locked. |task_runner| remains valid after
  // unlocking, because |task_runner_| is never reset.
  auto weak_this = weak_ptr_factory_.GetWeakPtr();
  task_runner->PostTask([weak_this, id] {
    if (weak_this)
      weak_this->producer_endpoint_->UnregisterTraceWriter(id);
  });
}